

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O2

void __thiscall Arcflow::reduce_redundancy(Arcflow *this)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  runtime_error *this_00;
  int i;
  long lVar4;
  const_iterator __last;
  __normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_> __i;
  __normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_> __last_00;
  __normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_> _Var5;
  const_iterator __first;
  long lVar6;
  __normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_> _Var7;
  vector<int,_std::allocator<int>_> *local_148;
  vector<int,_std::allocator<int>_> *local_140;
  vector<int,_std::allocator<int>_> types;
  Arc *pAVar8;
  
  if (this->ready != false) {
    snprintf((char *)&types,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ready == false",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x1a5);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,(char *)&types);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  types.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  types.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  types.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  lVar6 = 0x34;
  for (lVar4 = 0; lVar4 < (this->inst).nsizes; lVar4 = lVar4 + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              (&types,(value_type *)
                      ((long)&(((this->sitems).super__Vector_base<Item,_std::allocator<Item>_>.
                                _M_impl.super__Vector_impl_data._M_start)->w).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl + lVar6));
    lVar6 = lVar6 + 0x48;
  }
  local_148 = (vector<int,_std::allocator<int>_> *)CONCAT44(local_148._4_4_,0xffffffff);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&types,(int *)&local_148);
  _Var7._M_current =
       (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
       _M_start;
  _Var5._M_current =
       (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (_Var7._M_current != _Var5._M_current) {
    uVar3 = ((long)_Var5._M_current - (long)_Var7._M_current) / 0xc;
    lVar6 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Arc*,std::vector<Arc,std::allocator<Arc>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Arcflow::reduce_redundancy()::__0>>
              (_Var7,_Var5,(ulong)(((uint)lVar6 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fdabrandao[P]vpsolver_src_arcflow_cpp:428:19)>
                )&types);
    if ((long)_Var5._M_current - (long)_Var7._M_current < 0xc1) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Arc*,std::vector<Arc,std::allocator<Arc>>>,__gnu_cxx::__ops::_Iter_comp_iter<Arcflow::reduce_redundancy()::__0>>
                (_Var7,_Var5,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fdabrandao[P]vpsolver_src_arcflow_cpp:428:19)>
                  )&types);
    }
    else {
      __last_00._M_current = _Var7._M_current + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Arc*,std::vector<Arc,std::allocator<Arc>>>,__gnu_cxx::__ops::_Iter_comp_iter<Arcflow::reduce_redundancy()::__0>>
                (_Var7,__last_00,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fdabrandao[P]vpsolver_src_arcflow_cpp:428:19)>
                  )&types);
      for (; __last_00._M_current != _Var5._M_current;
          __last_00._M_current = __last_00._M_current + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Arc*,std::vector<Arc,std::allocator<Arc>>>,__gnu_cxx::__ops::_Val_comp_iter<Arcflow::reduce_redundancy()::__0>>
                  (__last_00,
                   (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fdabrandao[P]vpsolver_src_arcflow_cpp:428:19)>
                    )&types);
      }
    }
  }
  _Var7._M_current =
       (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
       _M_start;
  __last._M_current =
       (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  __first._M_current = __last._M_current;
  local_148 = &types;
  local_140 = &types;
  if (_Var7._M_current != __last._M_current) {
    do {
      _Var5._M_current = _Var7._M_current;
      _Var7._M_current = _Var5._M_current + 1;
      if (_Var7._M_current == __last._M_current) goto LAB_0010a350;
      bVar2 = __gnu_cxx::__ops::_Iter_comp_iter<Arcflow::reduce_redundancy()::$_1>::operator()
                        (&local_148,_Var5,_Var7);
    } while (!bVar2);
    while (pAVar8 = _Var7._M_current, _Var7._M_current = pAVar8 + 1,
          _Var7._M_current != __last._M_current) {
      bVar2 = __gnu_cxx::__ops::_Iter_comp_iter<Arcflow::reduce_redundancy()::$_1>::operator()
                        (&local_140,_Var5,_Var7);
      if (!bVar2) {
        _Var5._M_current[1].label = pAVar8[1].label;
        iVar1 = (_Var7._M_current)->v;
        _Var5._M_current[1].u = (_Var7._M_current)->u;
        _Var5._M_current[1].v = iVar1;
        _Var5._M_current = _Var5._M_current + 1;
      }
    }
    __last._M_current =
         (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    __first._M_current = _Var5._M_current + 1;
  }
LAB_0010a350:
  std::vector<Arc,_std::allocator<Arc>_>::erase(&this->A,__first,__last);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&types.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void Arcflow::reduce_redundancy() {
	throw_assert(ready == false);
	// remove redundant parallel arcs
	std::vector<int> types;
	for (int i = 0; i < inst.nsizes; i++) {
		types.push_back(sitems[i].type);
	}
	types.push_back(-1);
	auto comp_less = [&types](const Arc &a, const Arc &b) {
		return (a.u < b.u) ||
			   (a.u == b.u && a.v < b.v) ||
			   (a.u == b.u && a.v == b.v && types[a.label] < types[b.label]);
	};
	auto comp_equal = [&types](const Arc &a, const Arc &b) {
		return a.u == b.u && a.v == b.v && types[a.label] == types[b.label];
	};
	sort(all(A), comp_less);
	A.erase(unique(all(A), comp_equal), A.end());
}